

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::EnterFrame(SQVM *this,SQInteger newbase,SQInteger newtop,bool tailcall)

{
  SQInt32 *pSVar1;
  SQOuter **ppSVar2;
  CallInfo *pCVar3;
  int iVar4;
  SQObjectPtr *pSVar5;
  long lVar6;
  SQOuter *pSVar7;
  undefined7 in_register_00000009;
  bool bVar8;
  SQObjectPtr local_30;
  
  if ((int)CONCAT71(in_register_00000009,tailcall) == 0) {
    lVar6 = this->_callsstacksize;
    if (lVar6 == this->_alloccallsstacksize) {
      GrowCallStack(this);
      lVar6 = this->_callsstacksize;
    }
    this->_callsstacksize = lVar6 + 1;
    pCVar3 = this->_callsstack + lVar6;
    this->ci = pCVar3;
    iVar4 = (int)this->_stackbase;
    pCVar3->_prevstkbase = (int)newbase - iVar4;
    pCVar3->_prevtop = (int)this->_top - iVar4;
    pCVar3->_etraps = 0;
    pCVar3->_ncalls = 1;
    pCVar3->_generator = (SQGenerator *)0x0;
    pCVar3->_root = 0;
  }
  else {
    pSVar1 = &this->ci->_ncalls;
    *pSVar1 = *pSVar1 + 1;
  }
  this->_stackbase = newbase;
  this->_top = newtop;
  bVar8 = true;
  if ((long)(this->_stack)._size < newtop + 0xf) {
    if (this->_nmetamethodscall == 0) {
      local_30.super_SQObject._type = OT_NULL;
      local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
      sqvector<SQObjectPtr>::resize(&this->_stack,newtop + 0x3c,&local_30);
      SQObjectPtr::~SQObjectPtr(&local_30);
      if (this->_openouters != (SQOuter *)0x0) {
        pSVar5 = (this->_stack)._vals;
        pSVar7 = this->_openouters;
        do {
          ppSVar2 = &pSVar7->_next;
          pSVar7->_valptr = pSVar5 + pSVar7->_idx;
          pSVar7 = *ppSVar2;
        } while (*ppSVar2 != (SQOuter *)0x0);
      }
    }
    else {
      bVar8 = false;
      Raise_Error(this,"stack overflow, cannot resize stack while in a metamethod");
    }
  }
  return bVar8;
}

Assistant:

bool SQVM::EnterFrame(SQInteger newbase, SQInteger newtop, bool tailcall)
{
    if( !tailcall ) {
        if( _callsstacksize == _alloccallsstacksize ) {
            GrowCallStack();
        }
        ci = &_callsstack[_callsstacksize++];
        ci->_prevstkbase = (SQInt32)(newbase - _stackbase);
        ci->_prevtop = (SQInt32)(_top - _stackbase);
        ci->_etraps = 0;
        ci->_ncalls = 1;
        ci->_generator = NULL;
        ci->_root = SQFalse;
    }
    else {
        ci->_ncalls++;
    }

    _stackbase = newbase;
    _top = newtop;
    if(newtop + MIN_STACK_OVERHEAD > (SQInteger)_stack.size()) {
        if(_nmetamethodscall) {
            Raise_Error(_SC("stack overflow, cannot resize stack while in a metamethod"));
            return false;
        }
        _stack.resize(newtop + (MIN_STACK_OVERHEAD << 2));
        RelocateOuters();
    }
    return true;
}